

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaTypePtr xmlSchemaGetType(xmlSchemaPtr schema,xmlChar *name,xmlChar *nsName)

{
  int iVar1;
  xmlSchemaTypePtr pxVar2;
  void *pvVar3;
  char *name_00;
  
  if (name != (xmlChar *)0x0) {
    if ((nsName == (xmlChar *)0x0) ||
       (iVar1 = xmlStrEqual(nsName,(xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar1 == 0)) {
      if (schema == (xmlSchemaPtr)0x0) {
        return (xmlSchemaTypePtr)0x0;
      }
    }
    else {
      pxVar2 = xmlSchemaGetPredefinedType(name,nsName);
      if (schema == (xmlSchemaPtr)0x0 || pxVar2 != (xmlSchemaTypePtr)0x0) {
        return pxVar2;
      }
    }
    iVar1 = xmlStrEqual(nsName,schema->targetNamespace);
    if ((iVar1 != 0) &&
       (pxVar2 = (xmlSchemaTypePtr)xmlHashLookup(schema->typeDecl,name),
       pxVar2 != (xmlSchemaTypePtr)0x0)) {
      return pxVar2;
    }
    iVar1 = xmlHashSize(schema->schemasImports);
    if (1 < iVar1) {
      name_00 = "##";
      if (nsName != (xmlChar *)0x0) {
        name_00 = (char *)nsName;
      }
      pvVar3 = xmlHashLookup(schema->schemasImports,(xmlChar *)name_00);
      if (pvVar3 != (void *)0x0) {
        pxVar2 = (xmlSchemaTypePtr)
                 xmlHashLookup(*(xmlHashTablePtr *)(*(long *)((long)pvVar3 + 0x50) + 0x38),name);
        return pxVar2;
      }
    }
  }
  return (xmlSchemaTypePtr)0x0;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaGetType(xmlSchemaPtr schema, const xmlChar * name,
                 const xmlChar * nsName)
{
    xmlSchemaTypePtr ret = NULL;

    if (name == NULL)
        return (NULL);
    /* First try the built-in types. */
    if ((nsName != NULL) && xmlStrEqual(nsName, xmlSchemaNs)) {
	ret = xmlSchemaGetPredefinedType(name, nsName);
	if (ret != NULL)
	    goto exit;
	/*
	* Note that we try the parsed schemas as well here
	* since one might have parsed the S4S, which contain more
	* than the built-in types.
	* TODO: Can we optimize this?
	*/
    }
    if (schema != NULL) {
	WXS_FIND_GLOBAL_ITEM(typeDecl)
    }
exit:

#ifdef DEBUG
    if (ret == NULL) {
        if (nsName == NULL)
            fprintf(stderr, "Unable to lookup type %s", name);
        else
            fprintf(stderr, "Unable to lookup type %s:%s", name,
                    nsName);
    }
#endif
    return (ret);
}